

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

FileDescriptor __thiscall
google::OpenObjectFileContainingPcAndGetStartAddress
          (google *this,uint64_t pc,uint64_t *start_address,uint64_t *base_address,
          char *out_file_name,size_t out_file_name_size)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FileDescriptor local_550;
  int local_54c;
  FileDescriptor object_fd;
  int num_spaces;
  uint64_t file_offset;
  Elf64_Phdr phdr;
  int local_500;
  uint i;
  Elf64_Ehdr ehdr;
  char *flags_start;
  uint64_t end_address;
  char *eol;
  char *cursor;
  LineReader reader;
  char buf [1024];
  FileDescriptor local_48;
  undefined4 local_44;
  FileDescriptor mem_fd;
  FileDescriptor local_3c;
  size_t sStack_38;
  FileDescriptor maps_fd;
  size_t out_file_name_size_local;
  char *out_file_name_local;
  uint64_t *base_address_local;
  uint64_t *start_address_local;
  uint64_t pc_local;
  
  sStack_38 = out_file_name_size;
  iVar2 = (anonymous_namespace)::
          FailureRetry<google::OpenObjectFileContainingPcAndGetStartAddress(unsigned_long,unsigned_long&,unsigned_long&,char*,unsigned_long)::__0>
                    (4);
  glog_internal_namespace_::FileDescriptor::FileDescriptor(&local_3c,iVar2);
  bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool(&local_3c);
  if (bVar1) {
    iVar2 = (anonymous_namespace)::
            FailureRetry<google::OpenObjectFileContainingPcAndGetStartAddress(unsigned_long,unsigned_long&,unsigned_long&,char*,unsigned_long)::__1>
                      (4);
    glog_internal_namespace_::FileDescriptor::FileDescriptor(&local_48,iVar2);
    bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool(&local_48);
    if (bVar1) {
      iVar2 = glog_internal_namespace_::FileDescriptor::get(&local_3c);
      anon_unknown_0::LineReader::LineReader
                ((LineReader *)&cursor,iVar2,(char *)&reader.eod_,0x400,0);
      do {
        bVar1 = anon_unknown_0::LineReader::ReadLine
                          ((LineReader *)&cursor,&eol,(char **)&end_address);
        if (!bVar1) {
          glog_internal_namespace_::FileDescriptor::FileDescriptor
                    ((FileDescriptor *)this,(nullptr_t)0x0);
          local_44 = 1;
          goto LAB_0014b62a;
        }
        eol = GetHex(eol,(char *)end_address,start_address);
        if ((eol == (char *)end_address) || (*eol != '-')) {
          glog_internal_namespace_::FileDescriptor::FileDescriptor
                    ((FileDescriptor *)this,(nullptr_t)0x0);
          local_44 = 1;
          goto LAB_0014b62a;
        }
        eol = eol + 1;
        pcVar3 = GetHex(eol,(char *)end_address,(uint64_t *)&flags_start);
        if ((pcVar3 == (char *)end_address) || (*pcVar3 != ' ')) {
          eol = pcVar3;
          glog_internal_namespace_::FileDescriptor::FileDescriptor
                    ((FileDescriptor *)this,(nullptr_t)0x0);
          local_44 = 1;
          goto LAB_0014b62a;
        }
        ehdr._56_8_ = pcVar3 + 1;
        eol = (char *)ehdr._56_8_;
        while( true ) {
          bVar1 = false;
          if (eol < end_address) {
            bVar1 = *eol != ' ';
          }
          if (!bVar1) break;
          eol = eol + 1;
        }
        if ((eol == (char *)end_address) || (eol < pcVar3 + 5)) {
          glog_internal_namespace_::FileDescriptor::FileDescriptor
                    ((FileDescriptor *)this,(nullptr_t)0x0);
          local_44 = 1;
          goto LAB_0014b62a;
        }
        if (*(char *)ehdr._56_8_ == 'r') {
          iVar2 = glog_internal_namespace_::FileDescriptor::get(&local_48);
          bVar1 = ReadFromOffsetExact(iVar2,&local_500,0x40,*start_address);
          if ((bVar1) && (local_500 == 0x464c457f)) {
            if (ehdr.e_ident._8_2_ == 2) {
              *base_address = 0;
            }
            else if (ehdr.e_ident._8_2_ == 3) {
              *base_address = *start_address;
              for (phdr.p_align._4_4_ = 0; phdr.p_align._4_4_ != (ushort)ehdr.e_flags;
                  phdr.p_align._4_4_ = phdr.p_align._4_4_ + 1) {
                iVar2 = glog_internal_namespace_::FileDescriptor::get(&local_48);
                bVar1 = ReadFromOffsetExact(iVar2,&file_offset,0x38,
                                            *start_address + ehdr.e_entry +
                                            (ulong)phdr.p_align._4_4_ * 0x38);
                if (((bVar1) && ((int)file_offset == 1)) && (phdr._0_8_ == 0)) {
                  *base_address = *start_address - phdr.p_offset;
                  break;
                }
              }
            }
          }
        }
      } while (((pc < *start_address) || (flags_start <= pc)) ||
              ((*(char *)ehdr._56_8_ != 'r' || (*(char *)(ehdr._56_8_ + 2) != 'x'))));
      eol = eol + 1;
      eol = GetHex(eol,(char *)end_address,(uint64_t *)&object_fd);
      if ((eol == (char *)end_address) || (*eol != ' ')) {
        glog_internal_namespace_::FileDescriptor::FileDescriptor
                  ((FileDescriptor *)this,(nullptr_t)0x0);
        local_44 = 1;
      }
      else {
        local_54c = 0;
        do {
          while( true ) {
            eol = eol + 1;
            if (end_address <= eol) goto LAB_0014b552;
            if (*eol != ' ') break;
            local_54c = local_54c + 1;
          }
        } while (local_54c < 2);
LAB_0014b552:
        if (eol == (char *)end_address) {
          glog_internal_namespace_::FileDescriptor::FileDescriptor
                    ((FileDescriptor *)this,(nullptr_t)0x0);
          local_44 = 1;
        }
        else {
          iVar2 = (anonymous_namespace)::
                  FailureRetry<google::OpenObjectFileContainingPcAndGetStartAddress(unsigned_long,unsigned_long&,unsigned_long&,char*,unsigned_long)::__2>
                            ((anon_class_8_1_50ba0494)eol,4);
          glog_internal_namespace_::FileDescriptor::FileDescriptor(&local_550,iVar2);
          bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool(&local_550);
          if (bVar1) {
            glog_internal_namespace_::FileDescriptor::FileDescriptor
                      ((FileDescriptor *)this,&local_550);
          }
          else {
            strncpy(out_file_name,eol,sStack_38);
            out_file_name[sStack_38 - 1] = '\0';
            glog_internal_namespace_::FileDescriptor::FileDescriptor
                      ((FileDescriptor *)this,(nullptr_t)0x0);
          }
          local_44 = 1;
          glog_internal_namespace_::FileDescriptor::~FileDescriptor(&local_550);
        }
      }
    }
    else {
      glog_internal_namespace_::FileDescriptor::FileDescriptor
                ((FileDescriptor *)this,(nullptr_t)0x0);
      local_44 = 1;
    }
LAB_0014b62a:
    glog_internal_namespace_::FileDescriptor::~FileDescriptor(&local_48);
  }
  else {
    glog_internal_namespace_::FileDescriptor::FileDescriptor((FileDescriptor *)this,(nullptr_t)0x0);
    local_44 = 1;
  }
  glog_internal_namespace_::FileDescriptor::~FileDescriptor(&local_3c);
  return (FileDescriptor)(int)this;
}

Assistant:

static ATTRIBUTE_NOINLINE FileDescriptor
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t& start_address,
                                             uint64_t& base_address,
                                             char* out_file_name,
                                             size_t out_file_name_size) {
  FileDescriptor maps_fd{
      FailureRetry([] { return open("/proc/self/maps", O_RDONLY); })};
  if (!maps_fd) {
    return nullptr;
  }

  FileDescriptor mem_fd{
      FailureRetry([] { return open("/proc/self/mem", O_RDONLY); })};
  if (!mem_fd) {
    return nullptr;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  LineReader reader(maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    const char* cursor;
    const char* eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return nullptr;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char* const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return nullptr;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd.get(), &ehdr, sizeof(ElfW(Ehdr)),
                            start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd.get(), &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (start_address > pc || pc >= end_address) {
      continue;  // We skip this map.  PC isn't in this map.
    }

    // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return nullptr;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    FileDescriptor object_fd{
        FailureRetry([cursor] { return open(cursor, O_RDONLY); })};
    if (!object_fd) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return nullptr;
    }
    return object_fd;
  }
}